

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O1

size_t fiobj_hash_each1(FIOBJ o,size_t start_at,_func_int_FIOBJ_void_ptr *task,void *arg)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  
  if (((uint)o & 7) != 4) {
    __assert_fail("o && FIOBJ_TYPE_IS(o, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0x4c,"size_t fiobj_hash_each1(FIOBJ, size_t, int (*)(FIOBJ, void *), void *)");
  }
  uVar1 = *(undefined8 *)(in_FS_OFFSET + -0x288);
  uVar10 = o & 0xfffffffffffffff8;
  uVar7 = *(ulong *)(uVar10 + 0x18);
  if (*(ulong *)(uVar10 + 8) == uVar7) {
    if (start_at < *(ulong *)(uVar10 + 8)) {
      lVar9 = start_at * 0x18 + 0x10;
      do {
        uVar7 = start_at;
        lVar2 = *(long *)(uVar10 + 0x20);
        *(undefined8 *)(in_FS_OFFSET + -0x288) = *(undefined8 *)(lVar2 + -8 + lVar9);
        iVar4 = (*task)(*(FIOBJ *)(lVar2 + lVar9),arg);
        if (iVar4 == -1) break;
        start_at = uVar7 + 1;
        lVar9 = lVar9 + 0x18;
      } while (start_at < *(ulong *)(uVar10 + 8));
      start_at = uVar7 + 1;
    }
  }
  else {
    if (uVar7 == 0 || start_at == 0) {
      uVar6 = 0;
      sVar8 = 0;
    }
    else {
      plVar5 = (long *)(*(long *)(uVar10 + 0x20) + 8);
      uVar6 = 0;
      sVar8 = 0;
      do {
        start_at = (*plVar5 == 0) + start_at;
        sVar8 = (*plVar5 != 0) + sVar8;
        uVar6 = uVar6 + 1;
        if (start_at <= uVar6) break;
        plVar5 = plVar5 + 3;
      } while (uVar6 < uVar7);
    }
    start_at = sVar8;
    if (uVar6 < *(ulong *)(uVar10 + 0x18)) {
      lVar9 = uVar6 * 0x18 + 0x10;
      do {
        lVar2 = *(long *)(uVar10 + 0x20);
        lVar3 = *(long *)(lVar2 + -8 + lVar9);
        if (lVar3 != 0) {
          start_at = start_at + 1;
          *(long *)(in_FS_OFFSET + -0x288) = lVar3;
          iVar4 = (*task)(*(FIOBJ *)(lVar2 + lVar9),arg);
          if (iVar4 == -1) break;
        }
        uVar6 = uVar6 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar6 < *(ulong *)(uVar10 + 0x18));
    }
  }
  *(undefined8 *)(in_FS_OFFSET + -0x288) = uVar1;
  return start_at;
}

Assistant:

static size_t fiobj_hash_each1(FIOBJ o, size_t start_at,
                               int (*task)(FIOBJ obj, void *arg), void *arg) {
  assert(o && FIOBJ_TYPE_IS(o, FIOBJ_T_HASH));
  FIOBJ old_each_at_key = each_at_key;
  fio_hash___s *hash = &obj2hash(o)->hash;
  size_t count = 0;
  if (hash->count == hash->pos) {
    /* no holes in the hash, we can work as we please. */
    for (count = start_at; count < hash->count; ++count) {
      each_at_key = hash->ordered[count].obj.key;
      if (task((FIOBJ)hash->ordered[count].obj.obj, arg) == -1) {
        ++count;
        goto end;
      }
    }
  } else {
    size_t pos = 0;
    for (; pos < start_at && pos < hash->pos; ++pos) {
      /* counting */
      if (hash->ordered[pos].obj.key == FIOBJ_INVALID)
        ++start_at;
      else
        ++count;
    }
    for (; pos < hash->pos; ++pos) {
      /* performing */
      if (hash->ordered[pos].obj.key == FIOBJ_INVALID)
        continue;
      ++count;
      each_at_key = hash->ordered[pos].obj.key;
      if (task((FIOBJ)hash->ordered[pos].obj.obj, arg) == -1)
        break;
    }
  }
end:
  each_at_key = old_each_at_key;
  return count;
}